

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O3

LY_ERR lyd_new_any(lyd_node *parent,lys_module *module,char *name,void *value,
                  LYD_ANYDATA_VALUETYPE value_type,uint32_t options,lyd_node **node)

{
  LY_ERR LVar1;
  lys_module *plVar2;
  ly_ctx *ctx;
  size_t name_len;
  ly_ctx *ctx_00;
  lysc_node *parent_00;
  char *pcVar3;
  lyd_node *ret;
  LYD_ANYDATA_VALUETYPE local_4c;
  lysc_ext_instance *ext;
  lysc_node *schema;
  size_t local_38;
  
  ret = (lyd_node *)0x0;
  ext = (lysc_ext_instance *)0x0;
  if (parent == (lyd_node *)0x0) {
    plVar2 = module;
    if (module == (lys_module *)0x0) {
      pcVar3 = "parent || module";
      ctx_00 = (ly_ctx *)0x0;
      goto LAB_0012c729;
    }
  }
  else if (parent->schema == (lysc_node *)0x0) {
    plVar2 = (lys_module *)&parent[2].schema;
  }
  else {
    plVar2 = parent->schema->module;
  }
  ctx_00 = plVar2->ctx;
  if (parent == (lyd_node *)0x0 && node == (lyd_node **)0x0) {
    pcVar3 = "parent || node";
LAB_0012c729:
    ly_log(ctx_00,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar3,"lyd_new_any");
    return LY_EINVAL;
  }
  if (name == (char *)0x0) {
    pcVar3 = "name";
    goto LAB_0012c729;
  }
  if (value == (void *)0x0 && LYD_ANYDATA_STRING < value_type) {
    pcVar3 = "(value_type == LYD_ANYDATA_DATATREE) || (value_type == LYD_ANYDATA_STRING) || value";
    goto LAB_0012c729;
  }
  if (parent == (lyd_node *)0x0) {
    parent_00 = _DAT_00000008;
    if (module != (lys_module *)0x0) {
LAB_0012c74d:
      parent_00 = (lysc_node *)0x0;
      goto LAB_0012c7ab;
    }
  }
  else {
    parent_00 = parent->schema;
    if (parent_00 == (lysc_node *)0x0) {
      ctx = (ly_ctx *)parent[2].schema;
      if (ctx != (ly_ctx *)0x0 && module != (lys_module *)0x0) {
        if (ctx != module->ctx && module->ctx != (ly_ctx *)0x0) goto LAB_0012c779;
        goto LAB_0012c74d;
      }
    }
    else if ((module != (lys_module *)0x0) && (ctx = parent_00->module->ctx, ctx != (ly_ctx *)0x0))
    {
      if ((module->ctx != (ly_ctx *)0x0) && (ctx != module->ctx)) {
LAB_0012c779:
        ly_log(ctx,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
        return LY_EINVAL;
      }
      goto LAB_0012c7ab;
    }
    if (module != (lys_module *)0x0) goto LAB_0012c7ab;
  }
  module = parent_00->module;
LAB_0012c7ab:
  local_4c = value_type;
  schema = lys_find_child(parent_00,module,name,0,0x60,(options & 1) << 4);
  if ((parent != (lyd_node *)0x0) && (schema == (lysc_node *)0x0)) {
    pcVar3 = module->name;
    local_38 = strlen(pcVar3);
    name_len = strlen(name);
    LVar1 = ly_nested_ext_schema
                      (parent,(lysc_node *)0x0,pcVar3,local_38,LY_VALUE_JSON,(void *)0x0,name,
                       name_len,&schema,&ext);
    if ((LVar1 != LY_ENOT) && (LVar1 != LY_SUCCESS)) {
      return LVar1;
    }
  }
  if (schema == (lysc_node *)0x0) {
    ly_log(ctx_00,LY_LLERR,LY_EINVAL,"Any node \"%s\" not found.",name);
    return LY_ENOTFOUND;
  }
  LVar1 = lyd_create_any(schema,value,local_4c,(byte)(options >> 8) & 1,&ret);
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  if (ext != (lysc_ext_instance *)0x0) {
    ret->flags = ret->flags | 8;
  }
  if (parent != (lyd_node *)0x0) {
    lyd_insert_node(parent,(lyd_node **)0x0,ret,0);
  }
  if (node == (lyd_node **)0x0) {
    return LY_SUCCESS;
  }
  *node = ret;
  return LY_SUCCESS;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_any(struct lyd_node *parent, const struct lys_module *module, const char *name, const void *value,
        LYD_ANYDATA_VALUETYPE value_type, uint32_t options, struct lyd_node **node)
{
    LY_ERR r;
    struct lyd_node *ret = NULL;
    const struct lysc_node *schema;
    struct lysc_ext_instance *ext = NULL;
    const struct ly_ctx *ctx = parent ? LYD_CTX(parent) : (module ? module->ctx : NULL);
    uint32_t getnext_opts = (options & LYD_NEW_VAL_OUTPUT) ? LYS_GETNEXT_OUTPUT : 0;
    ly_bool use_value = (options & LYD_NEW_ANY_USE_VALUE) ? 1 : 0;

    LY_CHECK_ARG_RET(ctx, parent || module, parent || node, name,
            (value_type == LYD_ANYDATA_DATATREE) || (value_type == LYD_ANYDATA_STRING) || value, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(parent ? LYD_CTX(parent) : NULL, module ? module->ctx : NULL, LY_EINVAL);

    if (!module) {
        module = parent->schema->module;
    }

    schema = lys_find_child(parent ? parent->schema : NULL, module, name, 0, LYD_NODE_ANY, getnext_opts);
    if (!schema && parent) {
        r = ly_nested_ext_schema(parent, NULL, module->name, strlen(module->name), LY_VALUE_JSON, NULL, name,
                strlen(name), &schema, &ext);
        LY_CHECK_RET(r && (r != LY_ENOT), r);
    }
    LY_CHECK_ERR_RET(!schema, LOGERR(ctx, LY_EINVAL, "Any node \"%s\" not found.", name), LY_ENOTFOUND);

    LY_CHECK_RET(lyd_create_any(schema, value, value_type, use_value, &ret));
    if (ext) {
        ret->flags |= LYD_EXT;
    }
    if (parent) {
        lyd_insert_node(parent, NULL, ret, LYD_INSERT_NODE_DEFAULT);
    }

    if (node) {
        *node = ret;
    }
    return LY_SUCCESS;
}